

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solve_problem<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  double cost_constant;
  long lVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pbVar3;
  pointer pbVar4;
  pointer pcVar5;
  pointer pcVar6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  pointer pbVar9;
  pointer pbVar10;
  pointer pbVar11;
  pointer pcVar12;
  pointer pcVar13;
  pointer pcVar14;
  pointer psVar15;
  pointer psVar16;
  pointer psVar17;
  ulong uVar18;
  int n;
  random_engine rng;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  random_engine local_198;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_190;
  result local_178;
  quadratic_cost_type<double> local_c8;
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> local_a8;
  solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::file_observer>
  local_88;
  
  if (*(long *)(this + 0x128) != 0) {
    (**(code **)(this + 0x130))(this + 0x118,this);
  }
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  lVar1 = (ctx->parameters).limit;
  lVar2 = *(long *)&(ctx->parameters).seed;
  make_merged_constraints(&local_190,(context *)this,(problem *)ctx);
  n = (int)((ulong)(lVar1 - lVar2) >> 2) * -0x55555555;
  if ((local_190.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_190.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (lVar1._0_4_ = (ctx->parameters).seed, lVar1._4_4_ = (ctx->parameters).thread,
     lVar1 == (ctx->parameters).limit)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].value = (ctx->parameters).pushing_objective_amplifier;
  }
  else {
    uVar18 = std::chrono::_V2::system_clock::now();
    if ((ulong)*(uint *)(this + 0xa8) != 0) {
      uVar18 = (ulong)*(uint *)(this + 0xa8);
    }
    local_198._M_x = uVar18 % 0x7fffffff + (ulong)(uVar18 % 0x7fffffff == 0);
    quadratic_cost_type<double>::quadratic_cost_type
              (&local_c8,(objective_function *)&(ctx->parameters).delta,n);
    cost_constant = (ctx->parameters).pushing_objective_amplifier;
    local_88.m_ctx = (context *)this;
    if (*(int *)(this + 0xe4) == 1) {
      local_88.m_begin.__d.__r = (duration)0;
      local_88.m_end.__d.__r = (duration)0;
      local_88.m_best.x.super_bit_array_impl.m_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_block_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      local_88.m_best.value = INFINITY;
      local_88.m_best.duration = 0.0;
      local_88.m_best.hash = 0;
      local_88.m_best.loop = 0;
      local_88.m_best.remaining_constraints = 0x7fffffff;
      local_88.m_rng = &local_198;
      solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::pnm_observer>
      ::operator()(&local_178,
                   (solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::pnm_observer>
                    *)&local_88,&local_190,n,&local_c8,cost_constant);
    }
    else if (*(int *)(this + 0xe4) == 2) {
      local_88.m_begin.__d.__r = (duration)0;
      local_88.m_end.__d.__r = (duration)0;
      local_88.m_best.x.super_bit_array_impl.m_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_block_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      local_88.m_best.value = INFINITY;
      local_88.m_best.duration = 0.0;
      local_88.m_best.hash = 0;
      local_88.m_best.loop = 0;
      local_88.m_best.remaining_constraints = 0x7fffffff;
      local_88.m_rng = &local_198;
      solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::file_observer>
      ::operator()(&local_178,&local_88,&local_190,n,&local_c8,cost_constant);
    }
    else {
      local_88.m_begin.__d.__r = (duration)0;
      local_88.m_end.__d.__r = (duration)0;
      local_88.m_best.x.super_bit_array_impl.m_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_block_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      local_88.m_best.value = INFINITY;
      local_88.m_best.duration = 0.0;
      local_88.m_best.hash = 0;
      local_88.m_best.loop = 0;
      local_88.m_best.remaining_constraints = 0x7fffffff;
      local_88.m_rng = &local_198;
      solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
      ::operator()(&local_178,
                   (solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
                    *)&local_88,&local_190,n,&local_c8,cost_constant);
    }
    _Var8._M_pi = local_178.strings.
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar7 = local_178.strings.
             super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (__return_storage_ptr__->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    local_178.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_178.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var8._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pbVar11 = local_178.affected_vars.names.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar10 = local_178.affected_vars.names.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar9 = local_178.affected_vars.names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_178.affected_vars.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.affected_vars.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.affected_vars.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->method)._M_len = local_178.method._M_len;
    (__return_storage_ptr__->method)._M_str = local_178.method._M_str;
    pbVar3 = (__return_storage_ptr__->affected_vars).names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (__return_storage_ptr__->affected_vars).names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar9;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar11;
    if (pbVar3 != (pointer)0x0) {
      operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3);
    }
    pcVar14 = local_178.affected_vars.values.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pcVar13 = local_178.affected_vars.values.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pcVar12 = local_178.affected_vars.values.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar5 = (__return_storage_ptr__->affected_vars).values.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (__return_storage_ptr__->affected_vars).values.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    local_178.affected_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.affected_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.affected_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar12;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar13;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar14;
    if (pcVar5 != (pointer)0x0) {
      operator_delete(pcVar5,(long)pcVar6 - (long)pcVar5);
    }
    pbVar11 = local_178.variable_name.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar10 = local_178.variable_name.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar9 = local_178.variable_name.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (__return_storage_ptr__->variable_name).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (__return_storage_ptr__->variable_name).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178.variable_name.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.variable_name.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.variable_name.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar9;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar11;
    if (pbVar3 != (pointer)0x0) {
      operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3);
    }
    psVar17 = local_178.solutions.
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    psVar16 = local_178.solutions.
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_finish;
    psVar15 = local_178.solutions.
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->solutions).
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_178.solutions.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.solutions.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.solutions.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = psVar17;
    local_a8.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->solutions).
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->solutions).
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start = psVar15;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar16;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector(&local_a8);
    __return_storage_ptr__->status = local_178.status;
    __return_storage_ptr__->duration = local_178.duration;
    __return_storage_ptr__->loop = local_178.loop;
    __return_storage_ptr__->variables = local_178.variables;
    __return_storage_ptr__->constraints = local_178.constraints;
    __return_storage_ptr__->remaining_constraints = local_178.remaining_constraints;
    __return_storage_ptr__->annoying_variable = local_178.annoying_variable;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector
              (&local_178.solutions);
    if (local_178.variable_name.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.variable_name.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_178.affected_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.affected_vars.values.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_178.affected_vars.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.affected_vars.names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_178.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.strings.
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
        local_88.m_best.x.super_bit_array_impl.m_data._M_t.
        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
      operator_delete__((void *)local_88.m_best.x.super_bit_array_impl.m_data._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    }
    if (local_c8.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
      operator_delete__((void *)local_c8.indices._M_t.
                                super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl);
    }
    local_c8.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
    if ((tuple<baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
         )local_c8.quadratic_elements._M_t.
          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
          _M_head_impl !=
        (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>)0x0) {
      operator_delete__((void *)local_c8.quadratic_elements._M_t.
                                super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                .
                                super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                                ._M_head_impl);
    }
    local_c8.quadratic_elements._M_t.
    super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
    .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
          )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
            )0x0;
    if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
        local_c8.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
        _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
      operator_delete__((void *)local_c8.linear_elements._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
  }
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(ctx->parameters).time_limit;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(ctx->parameters).theta);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&__return_storage_ptr__->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).init_kappa_improve_increase);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->affected_vars).names,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).pushing_iteration_limit);
  std::vector<signed_char,_std::allocator<signed_char>_>::operator=
            (&(__return_storage_ptr__->affected_vars).values,
             (vector<signed_char,_std::allocator<signed_char>_> *)&(ctx->parameters).cost_norm);
  __return_storage_ptr__->variables = n;
  __return_storage_ptr__->constraints =
       (int)((ulong)((long)local_190.
                           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_190.
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  if (*(long *)(this + 0x168) != 0) {
    (**(code **)(this + 0x170))(this + 0x158,__return_storage_ptr__);
  }
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(&local_190);
  return __return_storage_ptr__;
}

Assistant:

inline result
solve_problem(const context& ctx, const problem& pb)
{
    if (ctx.start)
        ctx.start(ctx.parameters);

    result ret;

    auto variables = length(pb.vars.values);
    auto constraints{ make_merged_constraints(ctx, pb) };

    if (!constraints.empty() && !pb.vars.values.empty()) {
        random_engine rng(init_random_generator_seed(ctx));

        auto cost = Cost(pb.objective, variables);
        auto cost_constant = pb.objective.value;

        switch (ctx.parameters.observer) {
        case solver_parameters::observer_type::pnm: {
            using obs = pnm_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        case solver_parameters::observer_type::file: {
            using obs = file_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        default: {
            using obs = none_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
            break;
        }
        }
    } else {
        ret.status = result_status::success;
        ret.solutions.resize(1);
        ret.solutions.back().value = pb.objective.value;
    }

    ret.strings = pb.strings;
    ret.variable_name = std::move(pb.vars.names);
    ret.affected_vars = std::move(pb.affected_vars);
    ret.variables = variables;
    ret.constraints = length(constraints);

    if (ctx.finish)
        ctx.finish(ret);

    return ret;
}